

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id *pIVar3;
  Id unaff_EBP;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  Vector<spv::Id> members;
  Id local_4c;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  Id local_24;
  
  ppIVar1 = this->groupedTypes[0x1e].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)this->groupedTypes[0x1e].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
  bVar6 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    uVar5 = 1;
    do {
      pIVar2 = ppIVar1[uVar5 - 1];
      pIVar3 = (pIVar2->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((((long)*(pointer *)
                    ((long)&(pIVar2->operands).
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl + 8) - (long)pIVar3 & 0x3fffffffcU) == 8) && (*pIVar3 == type0)
          ) && (pIVar3[1] == type1)) {
        unaff_EBP = pIVar2->resultId;
        break;
      }
      bVar6 = uVar5 < (uVar4 & 0x7fffffff);
      bVar7 = uVar5 != (uVar4 & 0x7fffffff);
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  if (!bVar6) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_4c = type1;
    local_24 = type0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
               (iterator)0x0,&local_24);
    if (local_48._M_impl.super__Vector_impl_data._M_finish ==
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
                 (iterator)local_48._M_impl.super__Vector_impl_data._M_finish,&local_4c);
    }
    else {
      *local_48._M_impl.super__Vector_impl_data._M_finish = local_4c;
      local_48._M_impl.super__Vector_impl_data._M_finish =
           local_48._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    unaff_EBP = makeStructType(this,(Vector<Id> *)&local_48,"ResType");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_48);
  }
  return unaff_EBP;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    dxil_spv::Vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}